

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O2

bool __thiscall
HighsTransformedLp::untransform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<int,_std::allocator<int>_> *inds,double *rhs,bool integral)

{
  HighsSparseVectorSum *this_00;
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer ppVar4;
  pointer pHVar5;
  _Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_> _Var6;
  bool bVar7;
  HighsInt i_1;
  pointer piVar8;
  bool bVar9;
  HighsInt i;
  size_type sVar10;
  ulong uVar11;
  ulong uVar12;
  undefined7 in_register_00000081;
  HighsMipSolver *pHVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  ulong uVar15;
  HighsInt j;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  HighsCDouble tmpRhs;
  HighsInt rowlen;
  double *rowvals;
  HighsInt *rowinds;
  HighsCDouble local_88;
  HighsMipSolver *local_78;
  uint local_6c;
  vector<int,_std::allocator<int>_> *local_68;
  undefined4 local_5c;
  HighsTransformedLp *local_58;
  double *local_50;
  HighsInt *local_48;
  double *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000081,integral);
  local_88.hi = *rhs;
  local_88.lo = 0.0;
  pHVar13 = this->lprelaxation->mipsolver;
  local_58 = (HighsTransformedLp *)CONCAT44(local_58._4_4_,pHVar13->model_->num_col_);
  piVar8 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar2 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  this_00 = &this->vectorsum;
  local_78 = pHVar13;
  local_40 = rhs;
  local_38 = inds;
  for (uVar15 = 0; uVar15 != ((ulong)((long)piVar8 - (long)piVar2) >> 2 & 0xffffffff);
      uVar15 = uVar15 + 1) {
    pdVar3 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pvVar14 = (vector<int,_std::allocator<int>_> *)pdVar3[uVar15];
    if (((double)pvVar14 == 0.0) && (!NAN((double)pvVar14))) goto switchD_002ee21f_default;
    iVar16 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[uVar15];
    lVar17 = (long)iVar16;
    switch((this->boundTypes).
           super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar17]) {
    case kSimpleUb:
      if (iVar16 < (int)local_58) {
        HighsCDouble::operator-=
                  (&local_88,
                   (double)pvVar14 *
                   *(double *)
                    (*(long *)((long)(pHVar13->mipdata_)._M_t.
                                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                     .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x6b0) +
                    lVar17 * 8));
        dVar18 = -(vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar15];
LAB_002ee39e:
        HighsSparseVectorSum::add(this_00,iVar16,dVar18);
        pHVar13 = local_78;
      }
      else {
        iVar16 = iVar16 - (int)local_58;
        local_68 = pvVar14;
        dVar18 = HighsLpRelaxation::slackUpper(this->lprelaxation,iVar16);
        HighsCDouble::operator-=(&local_88,dVar18 * (double)local_68);
        pdVar3 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[uVar15] = -pdVar3[uVar15];
        HighsLpRelaxation::getRow
                  (this->lprelaxation,iVar16,(HighsInt *)&local_6c,&local_48,&local_50);
        for (uVar12 = 0; pHVar13 = local_78, uVar12 != local_6c; uVar12 = uVar12 + 1) {
          HighsSparseVectorSum::add
                    (this_00,local_48[uVar12],
                     (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar15] * local_50[uVar12]);
        }
      }
      break;
    case kSimpleLb:
      if (iVar16 < (int)local_58) {
        dVar18 = (double)pvVar14 *
                 *(double *)
                  (*(long *)((long)(pHVar13->mipdata_)._M_t.
                                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                   .super__Head_base<0UL,_HighsMipSolverData_*,_false> + 0x698) +
                  lVar17 * 8);
        dVar19 = local_88.hi + dVar18;
        local_88.lo = (local_88.hi - (dVar19 - dVar18)) + (dVar18 - (dVar19 - (dVar19 - dVar18))) +
                      local_88.lo;
        dVar18 = pdVar3[uVar15];
        local_88.hi = dVar19;
        goto LAB_002ee39e;
      }
      iVar16 = iVar16 - (int)local_58;
      local_68 = pvVar14;
      dVar18 = HighsLpRelaxation::slackLower(this->lprelaxation,iVar16);
      dVar18 = (double)local_68 * dVar18;
      dVar19 = local_88.hi + dVar18;
      local_88.lo = (local_88.hi - (dVar19 - dVar18)) + (dVar18 - (dVar19 - (dVar19 - dVar18))) +
                    local_88.lo;
      local_88.hi = dVar19;
      HighsLpRelaxation::getRow(this->lprelaxation,iVar16,(HighsInt *)&local_6c,&local_48,&local_50)
      ;
      for (uVar12 = 0; pHVar13 = local_78, uVar12 != local_6c; uVar12 = uVar12 + 1) {
        HighsSparseVectorSum::add
                  (this_00,local_48[uVar12],
                   (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar15] * local_50[uVar12]);
      }
      break;
    case kVariableUb:
      HighsCDouble::operator-=
                (&local_88,
                 (double)pvVar14 *
                 (this->bestVub).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar17].second.constant);
      inds = local_38;
      ppVar4 = (this->bestVub).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      HighsSparseVectorSum::add
                (this_00,ppVar4[lVar17].first,
                 (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar15] * ppVar4[lVar17].second.coef);
      dVar18 = -(vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar15];
      goto LAB_002ee321;
    case kVariableLb:
      ppVar4 = (this->bestVlb).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar18 = (double)pvVar14 * ppVar4[lVar17].second.constant;
      dVar19 = local_88.hi + dVar18;
      local_88.lo = (local_88.hi - (dVar19 - dVar18)) + (dVar18 - (dVar19 - (dVar19 - dVar18))) +
                    local_88.lo;
      local_88.hi = dVar19;
      HighsSparseVectorSum::add
                (this_00,ppVar4[lVar17].first,-pdVar3[uVar15] * ppVar4[lVar17].second.coef);
      dVar18 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar15];
LAB_002ee321:
      HighsSparseVectorSum::add(this_00,iVar16,dVar18);
      pHVar13 = local_78;
    }
switchD_002ee21f_default:
  }
  pvVar14 = &(this->vectorsum).nonzeroinds;
  piVar8 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = (ulong)((long)(this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar8) >> 2;
  if ((char)local_5c != '\0') {
    pHVar5 = (this_00->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = uVar15 & 0xffffffff;
    while( true ) {
      sVar10 = (size_type)(int)uVar15;
      if ((int)uVar12 < 1) break;
      iVar16 = piVar8[uVar12 - 1];
      uVar12 = uVar12 - 1;
      if (ABS(pHVar5[iVar16].hi + pHVar5[iVar16].lo) < 0.5) {
        uVar15 = (ulong)((int)uVar15 - 1);
        pHVar5[iVar16].hi = 0.0;
        pHVar5[iVar16].lo = 0.0;
        iVar1 = piVar8[sVar10 - 1];
        piVar8[sVar10 - 1] = iVar16;
        piVar8[uVar12] = iVar1;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(pvVar14,sVar10);
    dVar18 = round(local_88.hi + local_88.lo);
LAB_002ee6fe:
    *local_40 = dVar18;
    std::vector<int,_std::allocator<int>_>::operator=(inds,pvVar14);
    uVar15 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    std::vector<double,_std::allocator<double>_>::resize(vals,(long)(int)uVar15);
    piVar8 = (inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pHVar5 = (this->vectorsum).values.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = uVar15 & 0xffffffff;
    if ((char)local_5c == '\0') {
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        iVar16 = piVar8[uVar12];
        pdVar3[uVar12] = pHVar5[iVar16].hi + pHVar5[iVar16].lo;
      }
    }
    else {
      for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
        iVar16 = piVar8[uVar12];
        dVar18 = round(pHVar5[iVar16].hi + pHVar5[iVar16].lo);
        pdVar3[uVar12] = dVar18;
      }
    }
    bVar9 = true;
LAB_002ee798:
    HighsSparseVectorSum::clear(this_00);
    return bVar9;
  }
  uVar12 = uVar15 & 0xffffffff;
  bVar9 = false;
  local_58 = this;
  do {
    pHVar5 = (this_00->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = uVar12 & 0xffffffff;
    do {
      uVar12 = uVar12 - 1;
      sVar10 = (size_type)(int)uVar15;
      if ((int)uVar11 < 1) {
        std::vector<int,_std::allocator<int>_>::resize(pvVar14,sVar10);
        if (!bVar9) {
          dVar18 = local_88.hi + local_88.lo;
          this = local_58;
          goto LAB_002ee6fe;
        }
        bVar9 = false;
        goto LAB_002ee798;
      }
      lVar17 = (long)piVar8[uVar12];
      dVar18 = pHVar5[lVar17].hi + pHVar5[lVar17].lo;
      bVar7 = bVar9;
      if (ABS(dVar18) <= (pHVar13->options_mip_->super_HighsOptionsStruct).small_matrix_value)
      goto LAB_002ee68c;
      _Var6.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl =
           (pHVar13->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>;
      uVar11 = (ulong)((int)uVar11 - 1);
    } while (*(double *)
              ((long)_Var6.super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6620)
             < ABS(dVar18));
    if (dVar18 <= 0.0) {
      dVar19 = *(double *)
                (*(long *)((long)_Var6.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                 _M_head_impl + 0x6b0) + lVar17 * 8);
      bVar7 = true;
      if (dVar19 < INFINITY) goto LAB_002ee64a;
    }
    else {
      dVar19 = *(double *)
                (*(long *)((long)_Var6.super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                 _M_head_impl + 0x698) + lVar17 * 8);
      bVar7 = true;
      if (-INFINITY < dVar19) {
LAB_002ee64a:
        local_68 = pvVar14;
        HighsCDouble::operator-=(&local_88,dVar18 * dVar19);
        pHVar13 = local_78;
        pvVar14 = local_68;
        bVar7 = bVar9;
      }
    }
LAB_002ee68c:
    bVar9 = bVar7;
    uVar15 = (ulong)((int)uVar15 - 1);
    pHVar5 = (this_00->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar17;
    pHVar5->hi = 0.0;
    pHVar5->lo = 0.0;
    piVar8 = (pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar16 = piVar8[sVar10 - 1];
    piVar8[sVar10 - 1] = piVar8[uVar12];
    piVar8[uVar12] = iVar16;
  } while( true );
}

Assistant:

bool HighsTransformedLp::untransform(std::vector<double>& vals,
                                     std::vector<HighsInt>& inds, double& rhs,
                                     bool integral) {
  HighsCDouble tmpRhs = rhs;
  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = mip.numCol();

  HighsInt numNz = inds.size();

  for (HighsInt i = 0; i != numNz; ++i) {
    if (vals[i] == 0.0) continue;
    HighsInt col = inds[i];

    switch (boundTypes[col]) {
      case BoundType::kVariableLb: {
        tmpRhs += bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, -vals[i] * bestVlb[col].second.coef);
        vectorsum.add(col, vals[i]);
        break;
      }
      case BoundType::kVariableUb: {
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vectorsum.add(col, -vals[i]);
        break;
      }
      case BoundType::kSimpleLb: {
        if (col < slackOffset) {
          tmpRhs += vals[i] * mip.mipdata_->domain.col_lower_[col];
          vectorsum.add(col, vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs += vals[i] * lprelaxation.slackLower(row);

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
        break;
      }
      case BoundType::kSimpleUb: {
        if (col < slackOffset) {
          tmpRhs -= vals[i] * mip.mipdata_->domain.col_upper_[col];
          vectorsum.add(col, -vals[i]);
        } else {
          HighsInt row = col - slackOffset;
          tmpRhs -= vals[i] * lprelaxation.slackUpper(row);
          vals[i] = -vals[i];

          HighsInt rowlen;
          const HighsInt* rowinds;
          const double* rowvals;
          lprelaxation.getRow(row, rowlen, rowinds, rowvals);

          for (HighsInt j = 0; j != rowlen; ++j)
            vectorsum.add(rowinds[j], vals[i] * rowvals[j]);
        }
      }
    }
  }

  if (integral) {
    // if the cut is integral, we just round all coefficient values and the
    // right hand side to the nearest integral value, as small deviation
    // only come from numerical errors during resubstitution of slack variables

    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      return fabs(val) < 0.5;
    };

    vectorsum.cleanup(IsZero);
    rhs = std::round(double(tmpRhs));
  } else {
    bool abort = false;
    auto IsZero = [&](HighsInt col, double val) {
      assert(col < mip.numCol());
      double absval = std::abs(val);
      if (absval <= mip.options_mip_->small_matrix_value) return true;

      if (absval <= mip.mipdata_->feastol) {
        if (val > 0) {
          if (mip.mipdata_->domain.col_lower_[col] == -kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_lower_[col];
        } else {
          if (mip.mipdata_->domain.col_upper_[col] == kHighsInf)
            abort = true;
          else
            tmpRhs -= val * mip.mipdata_->domain.col_upper_[col];
        }
        return true;
      }
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (abort) {
      vectorsum.clear();
      return false;
    }
    rhs = double(tmpRhs);
  }

  inds = vectorsum.getNonzeros();
  numNz = inds.size();
  vals.resize(numNz);

  if (integral)
    for (HighsInt i = 0; i != numNz; ++i)
      vals[i] = std::round(vectorsum.getValue(inds[i]));
  else
    for (HighsInt i = 0; i != numNz; ++i) vals[i] = vectorsum.getValue(inds[i]);
  vectorsum.clear();

  return true;
}